

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall cmGeneratorTarget::IsChrpathUsed(cmGeneratorTarget *this,string *config)

{
  cmMakefile *pcVar1;
  bool bVar2;
  TargetType TVar3;
  int iVar4;
  ulong uVar5;
  char *__s1;
  allocator<char> local_149;
  string local_148;
  char *local_128;
  char *fmt;
  char *sep;
  undefined1 local_110 [8];
  string sepVar;
  string ll;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  local_20 = config;
  config_local = (string *)this;
  TVar3 = GetType(this);
  if (((TVar3 != SHARED_LIBRARY) && (TVar3 = GetType(this), TVar3 != MODULE_LIBRARY)) &&
     (TVar3 = GetType(this), TVar3 != EXECUTABLE)) {
    this_local._7_1_ = 0;
    goto LAB_0047d9b7;
  }
  bVar2 = cmTarget::GetHaveInstallRule(this->Target);
  if (!bVar2) {
    this_local._7_1_ = 0;
    goto LAB_0047d9b7;
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_SKIP_RPATH",&local_41);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (bVar2) {
    this_local._7_1_ = 0;
    goto LAB_0047d9b7;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"BUILD_WITH_INSTALL_RPATH",&local_79);
  bVar2 = GetPropertyAsBool(this,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  if (bVar2) {
    this_local._7_1_ = 0;
    goto LAB_0047d9b7;
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"CMAKE_NO_BUILTIN_CHRPATH",&local_a1);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  if (bVar2) {
    this_local._7_1_ = 0;
    goto LAB_0047d9b7;
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"CMAKE_PLATFORM_HAS_INSTALLNAME",
             (allocator<char> *)(ll.field_2._M_local_buf + 0xf));
  bVar2 = cmMakefile::IsOn(pcVar1,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)(ll.field_2._M_local_buf + 0xf));
  if (bVar2) {
    this_local._7_1_ = 1;
    goto LAB_0047d9b7;
  }
  GetLinkerLanguage((string *)((long)&sepVar.field_2 + 8),this,local_20);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_110,"CMAKE_SHARED_LIBRARY_RUNTIME_",
               (allocator<char> *)((long)&sep + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&sep + 7));
    std::__cxx11::string::operator+=
              ((string *)local_110,(string *)(sepVar.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_110,"_FLAG_SEP");
    fmt = cmMakefile::GetDefinition(this->Makefile,(string *)local_110);
    if ((fmt == (char *)0x0) || (*fmt == '\0')) {
LAB_0047d95b:
      bVar2 = false;
    }
    else {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"CMAKE_EXECUTABLE_FORMAT",&local_149);
      __s1 = cmMakefile::GetDefinition(pcVar1,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator(&local_149);
      local_128 = __s1;
      if (__s1 == (char *)0x0) goto LAB_0047d95b;
      iVar4 = strcmp(__s1,"ELF");
      this_local._7_1_ = iVar4 == 0;
      bVar2 = true;
    }
    std::__cxx11::string::~string((string *)local_110);
    if (!bVar2) goto LAB_0047d98d;
  }
  else {
LAB_0047d98d:
    this_local._7_1_ = 0;
  }
  std::__cxx11::string::~string((string *)(sepVar.field_2._M_local_buf + 8));
LAB_0047d9b7:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmGeneratorTarget::IsChrpathUsed(const std::string& config) const
{
  // Only certain target types have an rpath.
  if (!(this->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->GetType() == cmStateEnums::MODULE_LIBRARY ||
        this->GetType() == cmStateEnums::EXECUTABLE)) {
    return false;
  }

  // If the target will not be installed we do not need to change its
  // rpath.
  if (!this->Target->GetHaveInstallRule()) {
    return false;
  }

  // Skip chrpath if skipping rpath altogether.
  if (this->Makefile->IsOn("CMAKE_SKIP_RPATH")) {
    return false;
  }

  // Skip chrpath if it does not need to be changed at install time.
  if (this->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH")) {
    return false;
  }

  // Allow the user to disable builtin chrpath explicitly.
  if (this->Makefile->IsOn("CMAKE_NO_BUILTIN_CHRPATH")) {
    return false;
  }

  if (this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    return true;
  }

#if defined(CMAKE_USE_ELF_PARSER)
  // Enable if the rpath flag uses a separator and the target uses ELF
  // binaries.
  std::string ll = this->GetLinkerLanguage(config);
  if (!ll.empty()) {
    std::string sepVar = "CMAKE_SHARED_LIBRARY_RUNTIME_";
    sepVar += ll;
    sepVar += "_FLAG_SEP";
    const char* sep = this->Makefile->GetDefinition(sepVar);
    if (sep && *sep) {
      // TODO: Add ELF check to ABI detection and get rid of
      // CMAKE_EXECUTABLE_FORMAT.
      if (const char* fmt =
            this->Makefile->GetDefinition("CMAKE_EXECUTABLE_FORMAT")) {
        return strcmp(fmt, "ELF") == 0;
      }
    }
  }
#endif
  static_cast<void>(config);
  return false;
}